

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddrParser.cpp
# Opt level: O1

bool __thiscall axl::io::SockAddrParser::parse(SockAddrParser *this,in6_addr *addr)

{
  void *__src;
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  undefined1 uVar5;
  uint uVar6;
  ulong uVar7;
  char cVar8;
  size_t j;
  ulong uVar9;
  uint_t word;
  uint_t octet;
  undefined2 local_78;
  undefined2 local_76;
  uint local_74;
  ulong local_70;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_68;
  ulong local_50;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  
  skipWhiteSpace(this);
  pcVar1 = this->m_p;
  if ((pcVar1 < this->m_end) && (*pcVar1 == ':')) {
    this->m_p = pcVar1 + 1;
  }
  local_70 = 0xffffffffffffffff;
  uVar6 = (uint)(byte)local_78;
  local_50 = 0;
  uVar7 = 0;
  do {
    uVar5 = (undefined1)uVar6;
    if (7 < uVar7) goto LAB_0013cd61;
    skipWhiteSpace(this);
    pcVar1 = this->m_p;
    if ((pcVar1 < this->m_end) && (*pcVar1 == ':')) {
      this->m_p = pcVar1 + 1;
      local_70 = uVar7;
    }
    bVar3 = parseInt(this,&local_74,0x10);
    cVar8 = '\x01';
    if (bVar3) {
      skipWhiteSpace(this);
      pcVar1 = this->m_p;
      if ((pcVar1 < this->m_end) && (*pcVar1 == ':')) {
        this->m_p = pcVar1 + 1;
        bVar4 = 1;
      }
      else {
        bVar4 = 0;
      }
      if (bVar4 == 0) {
        skipWhiteSpace(this);
        pcVar1 = this->m_p;
        if ((pcVar1 < this->m_end) && (*pcVar1 == '.')) {
          this->m_p = pcVar1 + 1;
          bVar4 = 1;
        }
        else {
          bVar4 = 0;
        }
        if (bVar4 != 0) {
          if (uVar7 == 7) {
            err::Error::Error((Error *)&local_48,0x16);
            local_68.m_p = (ErrorHdr *)0x0;
            local_68.m_hdr = (BufHdr *)0x0;
            local_68.m_size = 0;
            rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_68,&local_48);
            rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
            err::setError((ErrorRef *)&local_68);
            rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_68);
            uVar7 = 7;
          }
          else {
            uVar6 = (local_74 >> 8 & 0xf) * 100 + (local_74 & 0xf) + (local_74 >> 4 & 0xf) * 10;
            cVar8 = '\x03';
            local_50 = 1;
          }
          goto LAB_0013cd1b;
        }
      }
      (addr->__in6_u).__u6_addr16[uVar7] = (ushort)local_74 << 8 | (ushort)local_74 >> 8;
      uVar7 = uVar7 + 1;
      cVar8 = (bVar4 ^ 1) * '\x03';
    }
LAB_0013cd1b:
    uVar5 = (undefined1)uVar6;
  } while (cVar8 == '\0');
  if (cVar8 == '\x03') {
LAB_0013cd61:
    local_78 = CONCAT11(local_78._1_1_,uVar5);
    if ((local_50 & 1) != 0) {
      uVar9 = 1;
      do {
        bVar3 = parseInt(this,(uint_t *)&local_48,10);
        if (bVar3) {
          *(undefined1 *)((long)&local_78 + uVar9) = local_48.m_p._0_1_;
          if (uVar9 < 3) {
            bVar3 = expectChar(this,'.');
            goto LAB_0013cdb0;
          }
          bVar2 = true;
          bVar3 = false;
        }
        else {
          bVar3 = false;
LAB_0013cdb0:
          bVar2 = false;
        }
        uVar9 = uVar9 + 1;
      } while (bVar3 != false);
      if (!bVar2) {
        return false;
      }
      (addr->__in6_u).__u6_addr16[uVar7] = local_78;
      *(undefined2 *)((long)&addr->__in6_u + uVar7 * 2 + 2) = local_76;
      uVar7 = uVar7 + 2;
    }
    if (local_70 != 0xffffffffffffffff) {
      if (local_70 <= uVar7 && uVar7 - local_70 != 0) {
        __src = (void *)((long)&addr->__in6_u + local_70 * 2);
        memmove((void *)((long)__src + (8 - uVar7) * 2),__src,(uVar7 - local_70) * 2);
        memset(__src,0,(8 - uVar7) * 2);
        return true;
      }
      return true;
    }
    if (uVar7 == 8) {
      return true;
    }
    err::Error::Error((Error *)&local_48,0x16);
    local_68.m_p = (ErrorHdr *)0x0;
    local_68.m_hdr = (BufHdr *)0x0;
    local_68.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_68,&local_48);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
    err::setError((ErrorRef *)&local_68);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_68);
  }
  return false;
}

Assistant:

bool
SockAddrParser::parse(in6_addr* addr) {
	bool result;

	uint16_t* ip = (uint16_t*)addr;

	size_t zeroRunIdx = -1;
	bool isIp4 = false;
	uchar_t ip4[4];

	tryChar(':');

	size_t i = 0;
	while (i < 8) {
		result = tryChar(':');
		if (result)
			zeroRunIdx = i;

		uint_t word;
		result = parseInt(&word, 16);
		if (!result)
			return false;

		result = tryChar(':');
		if (!result) {
			result = tryChar('.');
			if (result) {
				if (i > 6) {
					err::setError(err::SystemErrorCode_InvalidAddress);
					return false;
				}

				ip4[0] = (uchar_t)
					((word & 0x0f) +
					((word & 0xf0) >> 4) * 10 +
					((word & 0xf00) >> 8) * 100);

				isIp4 = true;
				break;
			}
		}

		ip[i] = sl::swapByteOrder16((uint16_t)word);
		i++;

		if (!result)
			break;
	}

	if (isIp4) {
		for (size_t j = 1;; j++) {
			uint_t octet;
			result = parseInt(&octet, 10);
			if (!result)
				return false;

			ip4[j] = (uchar_t)octet;

			if (j >= 3)
				break;

			result = expectChar('.');
			if (!result)
				return false;
		}

		ASSERT(i <= 6);
		ip[i] = ip4[0] + (ip4[1] << 8);
		ip[i + 1] = ip4[2] + (ip4[3] << 8);
		i += 2;
	}

	if (zeroRunIdx != -1) {
		ASSERT(i <= 8 && zeroRunIdx <= i);

		size_t zeroRunLength = 8 - i;

		if (zeroRunIdx < i) {
			memmove(&ip[zeroRunIdx + zeroRunLength], &ip[zeroRunIdx], (i - zeroRunIdx) * sizeof(uint16_t));
			memset(&ip[zeroRunIdx], 0, zeroRunLength * sizeof(uint16_t));
		}
	} else if (i != 8) {
		err::setError(err::SystemErrorCode_InvalidAddress);
		return false;
	}

	return true;
}